

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pline.c
# Opt level: O3

void warning(char *s,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list the_args;
  char str [256];
  undefined8 local_1e8;
  void **local_1e0;
  undefined1 *local_1d8;
  undefined1 local_1c8 [8];
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  char local_118 [256];
  
  local_1d8 = local_1c8;
  if (in_AL != '\0') {
    local_198 = in_XMM0_Qa;
    local_188 = in_XMM1_Qa;
    local_178 = in_XMM2_Qa;
    local_168 = in_XMM3_Qa;
    local_158 = in_XMM4_Qa;
    local_148 = in_XMM5_Qa;
    local_138 = in_XMM6_Qa;
    local_128 = in_XMM7_Qa;
  }
  local_1e0 = &the_args[0].overflow_arg_area;
  local_1e8 = 0x3000000008;
  local_1c0 = in_RSI;
  local_1b8 = in_RDX;
  local_1b0 = in_RCX;
  local_1a8 = in_R8;
  local_1a0 = in_R9;
  vsprintf(local_118,s,&local_1e8);
  paniclog("warning",local_118);
  vsprintf(local_118,s,&local_1e8);
  pline("Warning: %s\n",local_118);
  return;
}

Assistant:

void warning(const char *s, ...)
{
	char str[BUFSZ];
	va_list the_args;
	va_start(the_args, s);
	{
	    char pbuf[BUFSZ];
	    vsprintf(pbuf, s, the_args);
	    paniclog("warning", pbuf);
	}
	vsprintf(str, s, the_args);
	pline("Warning: %s\n", str);
	va_end(the_args);
}